

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Generators<unary_op_tuple<trng::portable_impl::uint128,_long_double>_> * __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,long_double>,unary_op_tuple<trng::portable_impl::uint128,long_double>,unary_op_tuple<trng::portable_impl::uint128,long_double>,unary_op_tuple<trng::portable_impl::uint128,long_double>>
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>
           *__return_storage_ptr__,Generators *this,
          unary_op_tuple<trng::portable_impl::uint128,_long_double> *val,
          unary_op_tuple<trng::portable_impl::uint128,_long_double> *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_long_double> *moreGenerators_1,
          unary_op_tuple<trng::portable_impl::uint128,_long_double> *moreGenerators_2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_long_double>_> local_30;
  
  local_30.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
        )operator_new(0x30);
  *(undefined ***)
   local_30.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_0031b0b8;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  lVar3 = *(long *)(this + 0x18);
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                  ._M_head_impl + 0x10) = *(long *)this;
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar1;
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar2;
  *(long *)((long)local_30.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar3;
  Generators<unary_op_tuple<trng::portable_impl::uint128,long_double>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,long_double>>,unary_op_tuple<trng::portable_impl::uint128,long_double>,unary_op_tuple<trng::portable_impl::uint128,long_double>,unary_op_tuple<trng::portable_impl::uint128,long_double>>
            ((Generators<unary_op_tuple<trng::portable_impl::uint128,long_double>> *)
             __return_storage_ptr__,&local_30,val,moreGenerators,moreGenerators_1);
  if (local_30.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_30.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_long_double>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }